

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O0

Var Js::WabtInterface::EntryConvertWast2Wasm(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e_00;
  BOOL BVar3;
  charcount_t cVar4;
  ScriptContext *scriptContext_00;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  DynamicObject *instance;
  PageAllocator *pageAllocator;
  char16 *sourceString;
  JavascriptLibrary *this;
  WabtAPIError *e;
  void *result;
  ChakraContext wabtCtx;
  SpecContext spec;
  anon_class_8_1_a7a63227 allocator;
  size_t origSize;
  char16 *str;
  JavascriptString *local_110;
  JavascriptString *string;
  char *wastBuffer;
  size_t wastSize;
  Context context;
  ArenaAllocator arena;
  Var isSpecVar;
  DynamicObject *configObject;
  undefined1 auStack_50 [7];
  bool isSpecText;
  ArgumentReader args;
  Var *_argsVarArray;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  scriptContext_00 = RecyclableObject::GetScriptContext(function);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x6d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)auStack_50,(CallInfo *)&function_local,values);
  if (((ulong)_auStack_50 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x6e,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  e_00 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                        CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                       CallFlags_New),CallFlags_New);
  bVar2 = operator!(e_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WabtInterface.cpp"
                                ,0x70,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (1 < (auStack_50._0_4_ & 0xffffff)) {
    pvVar8 = Arguments::operator[]((Arguments *)auStack_50,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar8);
    if (bVar2) {
      configObject._7_1_ = false;
      if (2 < (auStack_50._0_4_ & 0xffffff)) {
        pvVar8 = Arguments::operator[]((Arguments *)auStack_50,2);
        BVar3 = Js::JavascriptOperators::IsObject(pvVar8);
        if (BVar3 == 0) {
          JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ec71,L"config");
        }
        pvVar8 = Arguments::operator[]((Arguments *)auStack_50,2);
        instance = VarTo<Js::DynamicObject>(pvVar8);
        pvVar8 = Js::JavascriptOperators::OP_GetProperty(instance,0xf4,scriptContext_00);
        configObject._7_1_ = JavascriptConversion::ToBool(pvVar8,scriptContext_00);
      }
      pTVar6 = ScriptContext::GetThreadContext(scriptContext_00);
      pageAllocator = ThreadContext::GetPageAllocator(pTVar6);
      Memory::ArenaAllocator::ArenaAllocator
                ((ArenaAllocator *)&context.scriptContext,L"Wast2Wasm",pageAllocator,
                 Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
      string = (JavascriptString *)0x0;
      EnterPinnedScope(&local_110);
      local_110 = (JavascriptString *)Arguments::operator[]((Arguments *)auStack_50,1);
      sourceString = JavascriptString::GetString(local_110);
      wastSize = (size_t)&context.scriptContext;
      context.allocator = (ArenaAllocator *)scriptContext_00;
      cVar4 = JavascriptString::GetLength(local_110);
      utf8::
      WideStringToNarrow<Js::WabtInterface::EntryConvertWast2Wasm(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                ((anon_class_8_1_a7a63227)&context.scriptContext,sourceString,(ulong)cVar4,
                 (LPSTR *)&string,(size_t *)&wastBuffer,(size_t *)0x0);
      LeavePinnedScope();
      wabtCtx.spec = (SpecContext *)&wastSize;
      result = CreateBuffer;
      wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xfe | DAT_01e9e24e & 1;
      bVar2 = Wasm::Threads::IsEnabled();
      wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xfd | bVar2 * '\x02';
      bVar2 = Wasm::Simd::IsEnabled();
      wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xfb | bVar2 << 2;
      bVar2 = Wasm::WasmNontrapping::IsEnabled();
      wabtCtx.user_data._0_1_ = (byte)wabtCtx.user_data & 0xf7 | bVar2 << 3;
      if (configObject._7_1_ != false) {
        wabtCtx.createBuffer = (CreateBufferFn)&wabtCtx.features;
        wabtCtx._24_8_ = Js::SetProperty;
      }
      callInfo_local =
           (CallInfo)
           ChakraWabt::ConvertWast2Wasm
                     ((ChakraContext *)&result,(char *)string,(uint)wastBuffer,configObject._7_1_);
      if (callInfo_local == (CallInfo)0x0) {
        this = ScriptContext::GetLibrary(scriptContext_00);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      }
      Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&context.scriptContext);
      return (Var)callInfo_local;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5e4a6,(PCWSTR)0x0);
}

Assistant:

Js::Var WabtInterface::EntryConvertWast2Wasm(RecyclableObject* function, CallInfo callInfo, ...)
{
    ScriptContext* scriptContext = function->GetScriptContext();
    PROBE_STACK(function->GetScriptContext(), Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !VarIs<JavascriptString>(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }
    bool isSpecText = false;
    if (args.Info.Count > 2)
    {
        // optional config object
        if (!JavascriptOperators::IsObject(args[2]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("config"));
        }
        DynamicObject * configObject = VarTo<DynamicObject>(args[2]);

        Js::Var isSpecVar = JavascriptOperators::OP_GetProperty(configObject, PropertyIds::spec, scriptContext);
        isSpecText = JavascriptConversion::ToBool(isSpecVar, scriptContext);
    }

    ArenaAllocator arena(_u("Wast2Wasm"), scriptContext->GetThreadContext()->GetPageAllocator(), Throw::OutOfMemory);
    Context context;
    size_t wastSize;
    char* wastBuffer = nullptr;

    ENTER_PINNED_SCOPE(JavascriptString, string);
    string = (JavascriptString*)args[1];
    const char16* str = string->GetString();
    context.allocator = &arena;
    context.scriptContext = scriptContext;

    size_t origSize = string->GetLength();
    auto allocator = [&arena](size_t size) {return (utf8char_t*)AnewArray(&arena, byte, size);};
    utf8::WideStringToNarrow(allocator, str, origSize, &wastBuffer, &wastSize);
    LEAVE_PINNED_SCOPE();   //  string

    try
    {
        ChakraWabt::SpecContext spec;
        ChakraWabt::ChakraContext wabtCtx;
        wabtCtx.user_data = &context;
        wabtCtx.createBuffer = CreateBuffer;
        wabtCtx.features.sign_extends = CONFIG_FLAG(WasmSignExtends);
        wabtCtx.features.threads = Wasm::Threads::IsEnabled();
        wabtCtx.features.simd = Wasm::Simd::IsEnabled();
        wabtCtx.features.sat_float_to_int = Wasm::WasmNontrapping::IsEnabled();
        if (isSpecText)
        {
            wabtCtx.spec = &spec;
            spec.setProperty = SetProperty;
            spec.int32ToVar = Int32ToVar;
            spec.int64ToVar = Int64ToVar;
            spec.stringToVar = StringToVar;
            spec.createObject = CreateObject;
            spec.createArray = CreateArray;
            spec.push = Push;
        }
        void* result = ChakraWabt::ConvertWast2Wasm(wabtCtx, wastBuffer, (uint)wastSize, isSpecText);
        if (result == nullptr)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        return result;
    }
    catch (ChakraWabt::WabtAPIError& e)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, WABTERR_WabtError, NarrowStringToWide(&context, e.message));
    }
}